

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

size_type __thiscall cmList::ComputeInsertIndex(cmList *this,index_type pos,bool boundCheck)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  out_of_range *poVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  index_type pos_local;
  string local_48;
  unsigned_long local_28;
  unsigned_long local_20;
  
  uVar3 = pos;
  if ((int)CONCAT71(in_register_00000011,boundCheck) == 0) {
    if (pos < 0) {
      uVar3 = ((long)(this->Values).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Values).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) + pos;
    }
  }
  else {
    pbVar1 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pos_local = pos;
    if (pos != 0 && pbVar1 == pbVar2) {
      poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
      cmStrCat<char_const(&)[8],long&,char_const(&)[21]>
                (&local_48,(char (*) [8])0x6896fa,&pos_local,(char (*) [21])" out of range (0, 0)");
      std::out_of_range::out_of_range(poVar4,(string *)&local_48);
      __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (pbVar1 != pbVar2) {
      uVar5 = (long)pbVar2 - (long)pbVar1 >> 5;
      uVar3 = (pos >> 0x3f & uVar5) + pos;
      if (((long)uVar3 < 0) || (uVar5 < uVar3)) {
        poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
        local_28 = (long)(this->Values).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Values).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_20 = local_28;
        cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>
                  (&local_48,(char (*) [8])0x6896fa,&pos_local,(char (*) [17])" out of range (-",
                   &local_20,(char (*) [3])0x6ad8ed,&local_28,(char (*) [2])0x6e282b);
        std::out_of_range::out_of_range(poVar4,(string *)&local_48);
        __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    }
  }
  return uVar3;
}

Assistant:

cmList::size_type cmList::ComputeInsertIndex(index_type pos,
                                             bool boundCheck) const
{
  if (boundCheck) {
    if (this->Values.empty() && pos != 0) {
      throw std::out_of_range(
        cmStrCat("index: ", pos, " out of range (0, 0)"));
    }

    auto index = pos;
    if (!this->Values.empty()) {
      auto length = this->Values.size();
      if (index < 0) {
        index = static_cast<index_type>(length) + index;
      }
      if (index < 0 || length < static_cast<size_type>(index)) {
        throw std::out_of_range(cmStrCat("index: ", pos, " out of range (-",
                                         this->Values.size(), ", ",
                                         this->Values.size(), ")"));
      }
    }
    return index;
  }

  return pos < 0 ? this->Values.size() + pos : pos;
}